

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::BeginGlobal
          (BinaryReaderIR *this,Index index,Type type,bool mutable_)

{
  char *__s;
  Offset OVar1;
  size_t sVar2;
  pointer *__ptr;
  unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> field;
  Location loc;
  _Head_base<0UL,_wabt::GlobalModuleField_*,_false> local_58;
  GlobalModuleField *local_50;
  Location local_48;
  
  local_48.field_1.field_0.line = 0;
  local_48.field_1.field_0.first_column = 0;
  local_48.field_1.field_0.last_column = 0;
  local_48.filename.data_ = (char *)0x0;
  local_48.filename.size_._0_4_ = 0;
  local_48.filename.size_._4_4_ = 0;
  __s = this->filename_;
  sVar2 = strlen(__s);
  local_48.filename.size_._0_4_ = (undefined4)sVar2;
  local_48.filename.size_._4_4_ = (undefined4)(sVar2 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_48.field_1.field_0.line = (int)OVar1;
  local_48.field_1.field_0.first_column = (int)(OVar1 >> 0x20);
  local_48.filename.data_ = __s;
  MakeUnique<wabt::GlobalModuleField,wabt::Location>((wabt *)&local_50,&local_48);
  (local_50->global).type.enum_ = type.enum_;
  (local_50->global).mutable_ = mutable_;
  local_58._M_head_impl = local_50;
  local_50 = (GlobalModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                       *)&local_58);
  if (local_58._M_head_impl != (GlobalModuleField *)0x0) {
    (*((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_58._M_head_impl = (GlobalModuleField *)0x0;
  if (local_50 != (GlobalModuleField *)0x0) {
    (**(code **)(*(long *)local_50 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginGlobal(Index index, Type type, bool mutable_) {
  auto field = MakeUnique<GlobalModuleField>(GetLocation());
  Global& global = field->global;
  global.type = type;
  global.mutable_ = mutable_;
  module_->AppendField(std::move(field));
  return Result::Ok;
}